

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_lock.cpp
# Opt level: O1

unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> __thiscall
duckdb::StorageLockInternals::TryGetExclusiveLock(StorageLockInternals *this)

{
  int iVar1;
  element_type *this_00;
  long in_RSI;
  enable_shared_from_this<duckdb::StorageLockInternals> local_38;
  shared_ptr<duckdb::StorageLockInternals,_true> local_28;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)(in_RSI + 0x10));
  if (iVar1 == 0) {
    if (*(long *)(in_RSI + 0x38) == 0) {
      enable_shared_from_this<duckdb::StorageLockInternals>::shared_from_this(&local_38);
      this_00 = (element_type *)operator_new(0x18);
      local_28.internal.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = local_38.__weak_this_.internal.
                super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28.internal.super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           local_38.__weak_this_.internal.
           super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_38.__weak_this_.internal.
      super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_38.__weak_this_.internal.
      super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      StorageLockKey::StorageLockKey((StorageLockKey *)this_00,&local_28,EXCLUSIVE);
      (this->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.internal.
      super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
      if (local_28.internal.
          super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.internal.
                   super___shared_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_38.__weak_this_.internal.
          super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
               (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
               this;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.__weak_this_.internal.
                 super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
             (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x10));
  }
  (this->super_enable_shared_from_this<duckdb::StorageLockInternals>).__weak_this_.internal.
  super___weak_ptr<duckdb::StorageLockInternals,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)
         (unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>_>)this;
}

Assistant:

unique_ptr<StorageLockKey> TryGetExclusiveLock() {
		if (!exclusive_lock.try_lock()) {
			// could not lock mutex
			return nullptr;
		}
		if (read_count != 0) {
			// there are active readers - cannot get exclusive lock
			exclusive_lock.unlock();
			return nullptr;
		}
		// success!
		return make_uniq<StorageLockKey>(shared_from_this(), StorageLockType::EXCLUSIVE);
	}